

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int UYVYToI422(uint8_t *src_uyvy,int src_stride_uyvy,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,
              int dst_stride_u,uint8_t *dst_v,int dst_stride_v,int width,int height)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *UYVYToYRow;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *UYVYToUV422Row;
  int y;
  int in_stack_00000020;
  code *local_48;
  code *pcVar2;
  int local_38;
  int local_34;
  long local_30;
  uint local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  pcVar2 = UYVYToUV422Row_C;
  local_48 = UYVYToYRow_C;
  if (((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
      ((UYVYToUV422Row == (_func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *)0x0 ||
       ((int)(uint)dst_u < 1)))) || (in_stack_00000020 == 0)) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_stack_00000020 < 0) {
      in_stack_00000020 = -in_stack_00000020;
      local_10 = in_RDI + (in_stack_00000020 + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    local_34 = in_R9D;
    local_24 = in_ECX;
    if (((local_14 == (uint)dst_u * 2) && (in_ECX == (uint)dst_u)) &&
       ((in_R9D << 1 == (uint)dst_u &&
        ((y << 1 == (uint)dst_u && ((int)((uint)dst_u * in_stack_00000020) < 0x8001)))))) {
      dst_u._0_4_ = in_stack_00000020 * (uint)dst_u;
      in_stack_00000020 = 1;
      y = 0;
      local_34 = 0;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if (iVar1 != 0) {
      pcVar2 = UYVYToUV422Row_Any_SSE2;
      local_48 = UYVYToYRow_Any_SSE2;
      if (((uint)dst_u & 0xf) == 0) {
        pcVar2 = UYVYToUV422Row_SSE2;
        local_48 = UYVYToYRow_SSE2;
      }
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if (iVar1 != 0) {
      pcVar2 = UYVYToUV422Row_Any_AVX2;
      local_48 = UYVYToYRow_Any_AVX2;
      if (((uint)dst_u & 0x1f) == 0) {
        pcVar2 = UYVYToUV422Row_AVX2;
        local_48 = UYVYToYRow_AVX2;
      }
    }
    local_30 = in_R8;
    local_20 = in_RDX;
    for (local_38 = 0; local_38 < in_stack_00000020; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_30,UYVYToUV422Row,(uint)dst_u);
      (*local_48)(local_10,local_20,(uint)dst_u);
      local_10 = local_10 + local_14;
      local_20 = local_20 + (int)local_24;
      local_30 = local_30 + local_34;
      UYVYToUV422Row = UYVYToUV422Row + y;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int UYVYToI422(const uint8_t* src_uyvy,
               int src_stride_uyvy,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_u,
               int dst_stride_u,
               uint8_t* dst_v,
               int dst_stride_v,
               int width,
               int height) {
  int y;
  void (*UYVYToUV422Row)(const uint8_t* src_uyvy, uint8_t* dst_u,
                         uint8_t* dst_v, int width) = UYVYToUV422Row_C;
  void (*UYVYToYRow)(const uint8_t* src_uyvy, uint8_t* dst_y, int width) =
      UYVYToYRow_C;
  if (!src_uyvy || !dst_y || !dst_u || !dst_v || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_uyvy = src_uyvy + (height - 1) * src_stride_uyvy;
    src_stride_uyvy = -src_stride_uyvy;
  }
  // Coalesce rows.
  if (src_stride_uyvy == width * 2 && dst_stride_y == width &&
      dst_stride_u * 2 == width && dst_stride_v * 2 == width &&
      width * height <= 32768) {
    width *= height;
    height = 1;
    src_stride_uyvy = dst_stride_y = dst_stride_u = dst_stride_v = 0;
  }
#if defined(HAS_UYVYTOYROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    UYVYToUV422Row = UYVYToUV422Row_Any_SSE2;
    UYVYToYRow = UYVYToYRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      UYVYToUV422Row = UYVYToUV422Row_SSE2;
      UYVYToYRow = UYVYToYRow_SSE2;
    }
  }
#endif
#if defined(HAS_UYVYTOYROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    UYVYToUV422Row = UYVYToUV422Row_Any_AVX2;
    UYVYToYRow = UYVYToYRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      UYVYToUV422Row = UYVYToUV422Row_AVX2;
      UYVYToYRow = UYVYToYRow_AVX2;
    }
  }
#endif
#if defined(HAS_UYVYTOYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    UYVYToYRow = UYVYToYRow_Any_NEON;
    UYVYToUV422Row = UYVYToUV422Row_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      UYVYToYRow = UYVYToYRow_NEON;
      UYVYToUV422Row = UYVYToUV422Row_NEON;
    }
  }
#endif
#if defined(HAS_UYVYTOYROW_MMI) && defined(HAS_UYVYTOUV422ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    UYVYToYRow = UYVYToYRow_Any_MMI;
    UYVYToUV422Row = UYVYToUV422Row_Any_MMI;
    if (IS_ALIGNED(width, 16)) {
      UYVYToYRow = UYVYToYRow_MMI;
      UYVYToUV422Row = UYVYToUV422Row_MMI;
    }
  }
#endif
#if defined(HAS_UYVYTOYROW_MSA) && defined(HAS_UYVYTOUV422ROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    UYVYToYRow = UYVYToYRow_Any_MSA;
    UYVYToUV422Row = UYVYToUV422Row_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      UYVYToYRow = UYVYToYRow_MSA;
      UYVYToUV422Row = UYVYToUV422Row_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    UYVYToUV422Row(src_uyvy, dst_u, dst_v, width);
    UYVYToYRow(src_uyvy, dst_y, width);
    src_uyvy += src_stride_uyvy;
    dst_y += dst_stride_y;
    dst_u += dst_stride_u;
    dst_v += dst_stride_v;
  }
  return 0;
}